

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwrite.c
# Opt level: O1

int png_write_image_8bit(png_voidp argument)

{
  ushort uVar1;
  undefined8 *puVar2;
  png_structrp png_ptr;
  png_const_bytep row;
  png_byte pVar3;
  uint uVar4;
  png_const_bytep ppVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint alpha;
  int iVar9;
  int iVar10;
  uint reciprocal;
  int iVar11;
  ushort *puVar12;
  ushort *local_70;
  
  puVar2 = *argument;
  local_70 = *(ushort **)((long)argument + 0x28);
  png_ptr = *(png_structrp *)*puVar2;
  row = *(png_const_bytep *)((long)argument + 0x38);
  iVar9 = *(int *)(puVar2 + 2);
  uVar7 = *(uint *)((long)puVar2 + 0x14);
  uVar8 = (ulong)(uVar7 & 2) + 1;
  if ((uVar7 & 1) == 0) {
    if (iVar9 != 0) {
      iVar10 = *(int *)((long)puVar2 + 0xc);
      do {
        ppVar5 = row;
        puVar12 = local_70;
        if (iVar10 != 0) {
          do {
            uVar7 = (uint)*puVar12 * 0xff >> 0xf;
            *ppVar5 = (png_byte)
                      (((uint)png_sRGB_delta[uVar7] * ((uint)*puVar12 * 0xff & 0x7fff) >> 0xc) +
                       (uint)png_sRGB_base[uVar7] >> 8);
            ppVar5 = ppVar5 + 1;
            puVar12 = puVar12 + 1;
          } while (ppVar5 < row + (uint)((int)uVar8 * iVar10));
        }
        png_write_row(png_ptr,row);
        local_70 = (ushort *)((long)local_70 + (ulong)(*(uint *)((long)argument + 0x30) & 0xfffe));
        iVar9 = iVar9 + -1;
      } while (iVar9 != 0);
    }
  }
  else {
    uVar6 = uVar7 & 0x20;
    if (iVar9 != 0) {
      uVar8 = -(ulong)(uVar6 != 0) | uVar8;
      iVar10 = (uVar7 & 2) + 2;
      uVar7 = *(int *)((long)puVar2 + 0xc) * iVar10;
      local_70 = (ushort *)((long)local_70 + (ulong)(uVar6 >> 4));
      do {
        ppVar5 = row + (uVar6 >> 5);
        puVar12 = local_70;
        if (uVar7 != 0) {
          do {
            uVar1 = *(ushort *)((long)puVar12 + uVar8 * 2);
            alpha = (uint)uVar1;
            uVar4 = (alpha * 0x100 - (uint)uVar1) + 0x807f;
            pVar3 = (png_byte)(uVar4 >> 0x10);
            ppVar5[uVar8] = pVar3;
            reciprocal = 0;
            if ((pVar3 != '\0') && ((uVar4 >> 0x10 & 0xff) != 0xff)) {
              reciprocal = ((uVar1 >> 1) + 0x7f7f8080) / alpha;
            }
            puVar12 = (ushort *)((long)puVar12 + 2);
            ppVar5 = ppVar5 + 1;
            iVar11 = iVar10;
            do {
              pVar3 = png_unpremultiply((uint)*(ushort *)((long)puVar12 + -2),alpha,reciprocal);
              ppVar5[-1] = pVar3;
              puVar12 = (ushort *)((long)puVar12 + 2);
              ppVar5 = ppVar5 + 1;
              iVar11 = iVar11 + -1;
            } while (1 < iVar11);
          } while (ppVar5 < row + (uVar6 >> 5) + uVar7);
        }
        png_write_row(png_ptr,*(png_const_bytep *)((long)argument + 0x38));
        local_70 = (ushort *)((long)local_70 + (ulong)(*(uint *)((long)argument + 0x30) & 0xfffe));
        iVar9 = iVar9 + -1;
      } while (iVar9 != 0);
    }
  }
  return 1;
}

Assistant:

static int
png_write_image_8bit(png_voidp argument)
{
   png_image_write_control *display = png_voidcast(png_image_write_control*,
       argument);
   png_imagep image = display->image;
   png_structrp png_ptr = image->opaque->png_ptr;

   png_const_uint_16p input_row = png_voidcast(png_const_uint_16p,
       display->first_row);
   png_bytep output_row = png_voidcast(png_bytep, display->local_row);
   png_uint_32 y = image->height;
   unsigned int channels = (image->format & PNG_FORMAT_FLAG_COLOR) != 0 ?
       3 : 1;

   if ((image->format & PNG_FORMAT_FLAG_ALPHA) != 0)
   {
      png_bytep row_end;
      int aindex;

#   ifdef PNG_SIMPLIFIED_WRITE_AFIRST_SUPPORTED
      if ((image->format & PNG_FORMAT_FLAG_AFIRST) != 0)
      {
         aindex = -1;
         ++input_row; /* To point to the first component */
         ++output_row;
      }

      else
#   endif
      aindex = (int)channels;

      /* Use row_end in place of a loop counter: */
      row_end = output_row + image->width * (channels+1);

      for (; y > 0; --y)
      {
         png_const_uint_16p in_ptr = input_row;
         png_bytep out_ptr = output_row;

         while (out_ptr < row_end)
         {
            png_uint_16 alpha = in_ptr[aindex];
            png_byte alphabyte = (png_byte)PNG_DIV257(alpha);
            png_uint_32 reciprocal = 0;
            int c;

            /* Scale and write the alpha channel. */
            out_ptr[aindex] = alphabyte;

            if (alphabyte > 0 && alphabyte < 255)
               reciprocal = UNP_RECIPROCAL(alpha);

            c = (int)channels;
            do /* always at least one channel */
               *out_ptr++ = png_unpremultiply(*in_ptr++, alpha, reciprocal);
            while (--c > 0);

            /* Skip to next component (skip the intervening alpha channel) */
            ++in_ptr;
            ++out_ptr;
         } /* while out_ptr < row_end */

         png_write_row(png_ptr, png_voidcast(png_const_bytep,
             display->local_row));
         input_row += (png_uint_16)display->row_bytes/(sizeof (png_uint_16));
      } /* while y */
   }

   else
   {
      /* No alpha channel, so the row_end really is the end of the row and it
       * is sufficient to loop over the components one by one.
       */
      png_bytep row_end = output_row + image->width * channels;

      for (; y > 0; --y)
      {
         png_const_uint_16p in_ptr = input_row;
         png_bytep out_ptr = output_row;

         while (out_ptr < row_end)
         {
            png_uint_32 component = *in_ptr++;

            component *= 255;
            *out_ptr++ = (png_byte)PNG_sRGB_FROM_LINEAR(component);
         }

         png_write_row(png_ptr, output_row);
         input_row += (png_uint_16)display->row_bytes/(sizeof (png_uint_16));
      }
   }

   return 1;
}